

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArenaTest.cpp
# Opt level: O1

void __thiscall Arena_ConExcep_Test::TestBody(Arena_ConExcep_Test *this)

{
  char *pcVar1;
  bool bVar2;
  long lVar3;
  ostream *poVar4;
  undefined8 *puVar5;
  pointer *__ptr;
  long lVar6;
  AssertionResult gtest_ar;
  TrueWithString gtest_msg;
  AssertionResult gtest_ar_;
  Arena arena;
  char local_a9;
  AssertHelper local_a8 [2];
  long *local_98;
  char *pcStack_90;
  long local_88 [3];
  __uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_70 [5];
  Arena local_48;
  
  memt::Arena::Arena(&local_48);
  local_88[1] = 0;
  pcStack_90 = (char *)0x0;
  local_88[0] = 0;
  local_98 = local_88;
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    if ((ulong)((long)local_48._blocks._block._end - (long)local_48._blocks._block._position) < 0x50
       ) {
      memt::Arena::growCapacity(&local_48,0x50);
    }
    pcVar1 = local_48._blocks._block._position;
    local_48._blocks._block._position = local_48._blocks._block._position + 0x50;
    lVar6 = 0;
    do {
      lVar3 = (anonymous_namespace)::
              _frobby_Helper<(anonymous_namespace)::_frobby_ConExcepHelperTag,4ul>::_count + 1;
      (anonymous_namespace)::_frobby_Helper<(anonymous_namespace)::_frobby_ConExcepHelperTag,4ul>::
      _count = lVar3;
      *(long *)(pcVar1 + lVar6) = lVar3;
      if (lVar3 == 4) {
        local_a9 = 'T';
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)
                            &(anonymous_namespace)::
                             _frobby_Helper<(anonymous_namespace)::_frobby_ConExcepHelperTag,4ul>::
                             _log_abi_cxx11_,&local_a9,1);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        puVar5 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar5 = *(undefined8 *)(pcVar1 + lVar6);
        __cxa_throw(puVar5,&unsigned_long::typeinfo,0);
      }
      local_a9 = '+';
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)
                          &(anonymous_namespace)::
                           _frobby_Helper<(anonymous_namespace)::_frobby_ConExcepHelperTag,4ul>::
                           _log_abi_cxx11_,&local_a9,1);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      lVar6 = lVar6 + 8;
    } while (lVar6 != 0x50);
  }
  std::__cxx11::string::_M_replace((ulong)&local_98,0,pcStack_90,0x142965);
  testing::Message::Message((Message *)local_70);
  testing::internal::AssertHelper::AssertHelper
            (local_a8,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Macaulay2[P]memtailor/src/test/ArenaTest.cpp"
             ,0xb2,(char *)local_98);
  testing::internal::AssertHelper::operator=(local_a8,(Message *)local_70);
  testing::internal::AssertHelper::~AssertHelper(local_a8);
  if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_70[0]._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_70[0]._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl + 8))();
  }
  if (local_98 != local_88) {
    operator_delete(local_98,local_88[0] + 1);
  }
  memt::Arena::~Arena(&local_48);
  return;
}

Assistant:

TEST(Arena, ConExcep) {
  memt::Arena arena;
  ASSERT_THROW(arena.allocArray<ConExcepHelper>(10), size_t);
  ASSERT_EQ(ConExcepHelper::resetLog(), "+1+2+3T4-3-2-1");
  ASSERT_TRUE(arena.isEmpty());
}